

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::EmbedParameter::InternalSerializeWithCachedSizesToArray
          (EmbedParameter *this,bool deterministic,uint8 *target)

{
  FillerParameter *pFVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((uVar7 & 4) != 0) {
    uVar4 = this->num_output_;
    *target = '\b';
    pbVar8 = target + 1;
    uVar6 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar8 = (byte)uVar4 | 0x80;
        uVar6 = uVar4 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar4;
        uVar4 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar7 & 8) != 0) {
    uVar4 = this->input_dim_;
    *target = 0x10;
    pbVar8 = target + 1;
    uVar6 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar8 = (byte)uVar4 | 0x80;
        uVar6 = uVar4 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar4;
        uVar4 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar7 & 0x10) != 0) {
    bVar3 = this->bias_term_;
    *target = 0x18;
    target[1] = bVar3;
    target = target + 2;
  }
  if ((uVar7 & 1) != 0) {
    pFVar1 = this->weight_filler_;
    *target = 0x22;
    pbVar8 = target + 1;
    uVar4 = pFVar1->_cached_size_;
    uVar6 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar8 = (byte)uVar4 | 0x80;
        uVar6 = uVar4 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar4;
        uVar4 = uVar6;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar6;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar1,false,pbVar8 + 1);
  }
  if ((uVar7 & 2) != 0) {
    pFVar1 = this->bias_filler_;
    *target = 0x2a;
    pbVar8 = target + 1;
    uVar7 = pFVar1->_cached_size_;
    uVar4 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar8 = (byte)uVar7 | 0x80;
        uVar4 = uVar7 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar4;
      } while (bVar3);
    }
    *pbVar8 = (byte)uVar4;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar1,false,pbVar8 + 1);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* EmbedParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.EmbedParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->num_output(), target);
  }

  // optional uint32 input_dim = 2;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(2, this->input_dim(), target);
  }

  // optional bool bias_term = 3 [default = true];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->bias_term(), target);
  }

  // optional .caffe.FillerParameter weight_filler = 4;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 5;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, *this->bias_filler_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.EmbedParameter)
  return target;
}